

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::all2all<std::pair<int,int>>
               (pair<int,_int> *msgs,size_t size,pair<int,_int> *out,comm *comm)

{
  datatype dt;
  datatype local_38;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::all2all_big<std::pair<int,int>>(msgs,size,out,comm);
    return;
  }
  local_38.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
  local_38._vptr_datatype = (_func_int **)&PTR__datatype_00180c80;
  local_38.builtin = false;
  MPI_Alltoall(msgs,size & 0xffffffff,local_38.mpitype,out,size & 0xffffffff,local_38.mpitype,
               comm->mpi_comm);
  datatype::~datatype(&local_38);
  return;
}

Assistant:

void all2all(const T* msgs, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        impl::all2all_big(msgs, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Alltoall(const_cast<T*>(msgs), size, dt.type(), out, size, dt.type(), comm);
    }
}